

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

BrandArgumentList * __thiscall
capnp::Schema::getBrandArgumentsAtScope
          (BrandArgumentList *__return_storage_ptr__,Schema *this,uint64_t scopeId)

{
  Scope *pSVar1;
  uint64_t scopeId_00;
  bool bVar2;
  Scope **ppSVar3;
  Scope *scope;
  Iterator __end1;
  Iterator __begin1;
  Range<const_capnp::_::RawBrandedSchema::Scope_*> *__range1;
  Reader local_98;
  ArrayPtr<const_char> local_68;
  Fault local_58;
  Fault f;
  bool local_1a;
  DebugExpression<bool> local_19;
  uint64_t uStack_18;
  DebugExpression<bool> _kjCondition;
  uint64_t scopeId_local;
  Schema *this_local;
  
  uStack_18 = scopeId;
  getProto((Reader *)&f,this);
  local_1a = capnp::schema::Node::Reader::getIsGeneric((Reader *)&f);
  local_19 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a);
  bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_19);
  if (!bVar2) {
    getProto(&local_98,this);
    local_68 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_98);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[20],capnp::Text::Reader>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0xfb,FAILED,"getProto().getIsGeneric()",
               "_kjCondition,\"Not a generic type.\", getProto().getDisplayName()",&local_19,
               (char (*) [20])"Not a generic type.",(Reader *)&local_68);
    kj::_::Debug::Fault::fatal(&local_58);
  }
  ___begin1 = kj::range<capnp::_::RawBrandedSchema::Scope_const*>
                        (this->raw->scopes,this->raw->scopes + this->raw->scopeCount);
  __end1 = kj::Range<const_capnp::_::RawBrandedSchema::Scope_*>::begin
                     ((Range<const_capnp::_::RawBrandedSchema::Scope_*> *)&__begin1);
  scope = (Scope *)kj::Range<const_capnp::_::RawBrandedSchema::Scope_*>::end
                             ((Range<const_capnp::_::RawBrandedSchema::Scope_*> *)&__begin1);
  while( true ) {
    bVar2 = kj::Range<const_capnp::_::RawBrandedSchema::Scope_*>::Iterator::operator==
                      (&__end1,(Iterator *)&scope);
    scopeId_00 = uStack_18;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar2 = capnp::_::RawBrandedSchema::isUnbound(this->raw);
      BrandArgumentList::BrandArgumentList(__return_storage_ptr__,scopeId_00,bVar2);
      return __return_storage_ptr__;
    }
    ppSVar3 = kj::Range<const_capnp::_::RawBrandedSchema::Scope_*>::Iterator::operator*(&__end1);
    pSVar1 = *ppSVar3;
    if (pSVar1->typeId == uStack_18) break;
    kj::Range<const_capnp::_::RawBrandedSchema::Scope_*>::Iterator::operator++(&__end1);
  }
  if ((pSVar1->isUnbound & 1U) != 0) {
    BrandArgumentList::BrandArgumentList(__return_storage_ptr__,uStack_18,true);
    return __return_storage_ptr__;
  }
  BrandArgumentList::BrandArgumentList
            (__return_storage_ptr__,uStack_18,pSVar1->bindingCount,pSVar1->bindings);
  return __return_storage_ptr__;
}

Assistant:

Schema::BrandArgumentList Schema::getBrandArgumentsAtScope(uint64_t scopeId) const {
  KJ_REQUIRE(getProto().getIsGeneric(), "Not a generic type.", getProto().getDisplayName());

  for (auto scope: kj::range(raw->scopes, raw->scopes + raw->scopeCount)) {
    if (scope->typeId == scopeId) {
      // OK, this scope matches the scope we're looking for.
      if (scope->isUnbound) {
        return BrandArgumentList(scopeId, true);
      } else {
        return BrandArgumentList(scopeId, scope->bindingCount, scope->bindings);
      }
    }
  }

  // This scope is not listed in the scopes list.
  return BrandArgumentList(scopeId, raw->isUnbound());
}